

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs
          (cbtGImpactCollisionAlgorithm *this,cbtTransform *trans0,cbtTransform *trans1,
          cbtGImpactShapeInterface *shape0,cbtCollisionShape *shape1,
          cbtAlignedObjectArray<int> *collided_primitives)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  cbtAABB boxshape;
  cbtTransform trans1to0;
  cbtAABB local_98;
  int *local_78;
  cbtTransform local_70;
  
  if ((shape0->m_box_set).m_box_tree.m_num_nodes == 0) {
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,trans1,&local_98,&local_98.m_max);
    uVar3 = (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x16])
                      (shape0);
    if (uVar3 != 0) {
      do {
        uVar3 = uVar3 - 1;
        (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x1e])
                  (shape0,(ulong)uVar3,trans0,&local_70,local_70.m_basis.m_el + 1);
        if ((((local_98.m_min.m_floats[0] <= local_70.m_basis.m_el[1].m_floats[0]) &&
             (local_70.m_basis.m_el[0].m_floats[0] <= local_98.m_max.m_floats[0])) &&
            (local_98.m_min.m_floats[1] <= local_70.m_basis.m_el[1].m_floats[1])) &&
           (((local_70.m_basis.m_el[0].m_floats[1] <= local_98.m_max.m_floats[1] &&
             (local_98.m_min.m_floats[2] <= local_70.m_basis.m_el[1].m_floats[2])) &&
            (local_70.m_basis.m_el[0].m_floats[2] <= local_98.m_max.m_floats[2])))) {
          iVar1 = collided_primitives->m_size;
          if (iVar1 == collided_primitives->m_capacity) {
            iVar5 = iVar1 * 2;
            if (iVar1 == 0) {
              iVar5 = 1;
            }
            if (collided_primitives->m_capacity < iVar5) {
              if (iVar5 == 0) {
                piVar4 = (int *)0x0;
              }
              else {
                piVar4 = (int *)cbtAlignedAllocInternal((long)iVar5 << 2,0x10);
              }
              iVar1 = collided_primitives->m_size;
              if (0 < (long)iVar1) {
                piVar2 = collided_primitives->m_data;
                lVar6 = 0;
                do {
                  piVar4[lVar6] = piVar2[lVar6];
                  lVar6 = lVar6 + 1;
                } while (iVar1 != lVar6);
              }
              if (collided_primitives->m_data != (int *)0x0) {
                if (collided_primitives->m_ownsMemory == true) {
                  local_78 = piVar4;
                  cbtAlignedFreeInternal(collided_primitives->m_data);
                  piVar4 = local_78;
                }
                collided_primitives->m_data = (int *)0x0;
              }
              collided_primitives->m_ownsMemory = true;
              collided_primitives->m_data = piVar4;
              collided_primitives->m_capacity = iVar5;
            }
          }
          collided_primitives->m_data[collided_primitives->m_size] = uVar3;
          collided_primitives->m_size = collided_primitives->m_size + 1;
        }
      } while (uVar3 != 0);
    }
  }
  else {
    cbtTransform::inverse(trans0);
    cbtTransform::operator*=(&local_70,trans1);
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,&local_70,&local_98,&local_98.m_max);
    cbtGImpactQuantizedBvh::boxQuery(&shape0->m_box_set,&local_98,collided_primitives);
  }
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs(
	const cbtTransform& trans0,
	const cbtTransform& trans1,
	const cbtGImpactShapeInterface* shape0,
	const cbtCollisionShape* shape1,
	cbtAlignedObjectArray<int>& collided_primitives)
{
	cbtAABB boxshape;

	if (shape0->hasBoxSet())
	{
		cbtTransform trans1to0 = trans0.inverse();
		trans1to0 *= trans1;

		shape1->getAabb(trans1to0, boxshape.m_min, boxshape.m_max);

		shape0->getBoxSet()->boxQuery(boxshape, collided_primitives);
	}
	else
	{
		shape1->getAabb(trans1, boxshape.m_min, boxshape.m_max);

		cbtAABB boxshape0;
		int i = shape0->getNumChildShapes();

		while (i--)
		{
			shape0->getChildAabb(i, trans0, boxshape0.m_min, boxshape0.m_max);

			if (boxshape.has_collision(boxshape0))
			{
				collided_primitives.push_back(i);
			}
		}
	}
}